

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

void h2o_start_response(h2o_req_t *req,h2o_generator_t *generator)

{
  ulong uVar1;
  h2o_filter_t **pphVar2;
  _func_void_st_h2o_filter_t_ptr_h2o_req_t_ptr_h2o_ostream_t_ptr_ptr *UNRECOVERED_JUMPTABLE;
  h2o_filter_t *phVar3;
  
  retain_original_response(req);
  if (req->_generator != (h2o_generator_t *)0x0) {
    __assert_fail("req->_generator == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/core/request.c"
                  ,0x19a,"void h2o_start_response(h2o_req_t *, h2o_generator_t *)");
  }
  req->_generator = generator;
  phVar3 = (h2o_filter_t *)req->prefilters;
  if (phVar3 == (h2o_filter_t *)0x0) {
    uVar1 = req->_next_filter_index;
    if ((req->pathconf->filters).size <= uVar1) {
      return;
    }
    pphVar2 = (req->pathconf->filters).entries;
    req->_next_filter_index = uVar1 + 1;
    phVar3 = pphVar2[uVar1];
    UNRECOVERED_JUMPTABLE = phVar3->on_setup_ostream;
  }
  else {
    UNRECOVERED_JUMPTABLE =
         (_func_void_st_h2o_filter_t_ptr_h2o_req_t_ptr_h2o_ostream_t_ptr_ptr *)
         phVar3->on_context_init;
  }
  (*UNRECOVERED_JUMPTABLE)((st_h2o_req_prefilter_t *)phVar3,req,&req->_ostr_top);
  return;
}

Assistant:

void h2o_start_response(h2o_req_t *req, h2o_generator_t *generator)
{
    retain_original_response(req);

    /* set generator */
    assert(req->_generator == NULL);
    req->_generator = generator;

    /* setup response filters */
    if (req->prefilters != NULL) {
        req->prefilters->on_setup_ostream(req->prefilters, req, &req->_ostr_top);
    } else {
        h2o_setup_next_ostream(req, &req->_ostr_top);
    }
}